

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O0

void booster::locale::impl::ios_prop<booster::locale::ios_info>::set(ios_info *prop,ios_base *ios)

{
  void **ppvVar1;
  ios_base *this;
  void *pvVar2;
  _func_void_event_ios_base_ptr_int *in_RSI;
  ios_info *in_RDI;
  int id;
  ios_info *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  int __ix;
  ios_base *in_stack_ffffffffffffffd0;
  ios_info *in_stack_ffffffffffffffd8;
  ios_info *in_stack_ffffffffffffffe0;
  
  __ix = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  get_id();
  ppvVar1 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
  if (*ppvVar1 == (void *)0x0) {
    this = (ios_base *)operator_new(0x50);
    ios_info::ios_info(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    ppvVar1 = std::ios_base::pword(this,__ix);
    *ppvVar1 = this;
    std::ios_base::register_callback(in_RSI,0x234180);
  }
  else {
    ppvVar1 = std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
    if (*ppvVar1 == (void *)0xffffffffffffffff) {
      pvVar2 = operator_new(0x50);
      ios_info::ios_info(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      ppvVar1 = std::ios_base::pword(in_stack_ffffffffffffffd0,(int)((ulong)pvVar2 >> 0x20));
      *ppvVar1 = pvVar2;
    }
    else {
      std::ios_base::pword(in_stack_ffffffffffffffd0,__ix);
      ios_info::operator=(in_RDI,in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

static void set(Property const &prop,std::ios_base &ios)
                {
                    int id=get_id();
                    if(ios.pword(id)==0) {
                        ios.pword(id) = new Property(prop);
                        ios.register_callback(callback,id);
                    }
                    else if(ios.pword(id)==invalid) {
                        ios.pword(id) = new Property(prop);
                    }
                    else {
                        *static_cast<Property *>(ios.pword(id))=prop;
                    }
                }